

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

StringLocalizationInfo * __thiscall icu_63::LocDataParser::doParse(LocDataParser *this)

{
  void **ppvVar1;
  int32_t iVar2;
  UBool UVar3;
  UChar UVar4;
  UChar **elem;
  StringLocalizationInfo *pSVar5;
  UChar *pUVar6;
  UChar *pUVar7;
  char *in_RSI;
  UChar **ppUVar8;
  bool bVar9;
  int32_t requiredLength;
  VArray array;
  int local_4c;
  VArray local_48;
  
  pUVar7 = this->e;
  pUVar6 = this->p;
  if (pUVar6 < pUVar7) {
    UVar4 = this->ch;
    do {
      if (UVar4 == L'\xffff') {
        UVar4 = *pUVar6;
      }
      UVar3 = PatternProps::isWhiteSpace((uint)(ushort)UVar4);
      pUVar7 = this->e;
      pUVar6 = this->p;
      if (UVar3 == '\0') break;
      pUVar6 = pUVar6 + 1;
      this->p = pUVar6;
      this->ch = L'\xffff';
      UVar4 = L'\xffff';
    } while (pUVar6 < pUVar7);
  }
  if ((pUVar6 < pUVar7) && ((this->ch == L'<' || (*pUVar6 == L'<')))) {
    this->p = pUVar6 + 1;
    this->ch = L'\xffff';
    local_48.buf = (UChar ***)0x0;
    local_48.cap = 0;
    local_48.size = 0;
    local_48.deleter = DeleteFn;
    local_4c = -1;
    do {
      ppUVar8 = (UChar **)&local_4c;
      elem = nextArray(this,&local_4c);
      pUVar7 = this->e;
      pUVar6 = this->p;
      if (pUVar6 < pUVar7) {
        UVar4 = this->ch;
        do {
          if (UVar4 == L'\xffff') {
            UVar4 = *pUVar6;
          }
          UVar3 = PatternProps::isWhiteSpace((uint)(ushort)UVar4);
          pUVar7 = this->e;
          pUVar6 = this->p;
          if (UVar3 == '\0') break;
          pUVar6 = pUVar6 + 1;
          this->p = pUVar6;
          this->ch = L'\xffff';
          UVar4 = L'\xffff';
        } while (pUVar6 < pUVar7);
      }
      if (pUVar6 < pUVar7) {
        if (this->ch == L',') {
          bVar9 = true;
          if (elem != (UChar **)0x0) goto LAB_002bb291;
        }
        else {
          bVar9 = *pUVar6 == L',';
          if (elem != (UChar **)0x0) goto LAB_002bb291;
          if (*pUVar6 != L',') goto LAB_002bb2c8;
        }
        parseError(this,(char *)ppUVar8);
        goto LAB_002bb353;
      }
      if (elem == (UChar **)0x0) goto LAB_002bb2c8;
      bVar9 = false;
LAB_002bb291:
      VArray::add(&local_48,elem,this->ec);
      ppUVar8 = elem;
      if (!bVar9) goto LAB_002bb2c8;
      this->p = this->p + 1;
      this->ch = L'\xffff';
    } while( true );
  }
LAB_002bb385:
  parseError(this,in_RSI);
  return (StringLocalizationInfo *)0x0;
LAB_002bb2c8:
  pUVar7 = this->e;
  pUVar6 = this->p;
  if (pUVar6 < pUVar7) {
    UVar4 = this->ch;
    do {
      if (UVar4 == L'\xffff') {
        UVar4 = *pUVar6;
      }
      UVar3 = PatternProps::isWhiteSpace((uint)(ushort)UVar4);
      pUVar7 = this->e;
      pUVar6 = this->p;
      if (UVar3 == '\0') break;
      pUVar6 = pUVar6 + 1;
      this->p = pUVar6;
      this->ch = L'\xffff';
      UVar4 = L'\xffff';
    } while (pUVar6 < pUVar7);
  }
  if ((pUVar6 < pUVar7) && ((this->ch == L'>' || (*pUVar6 == L'>')))) {
    do {
      pUVar6 = pUVar6 + 1;
      this->p = pUVar6;
      this->ch = L'\xffff';
      if (pUVar7 <= pUVar6) break;
      UVar3 = PatternProps::isWhiteSpace((uint)(ushort)*pUVar6);
      pUVar7 = this->e;
      pUVar6 = this->p;
    } while (UVar3 != '\0');
    if (pUVar6 != pUVar7) goto LAB_002bb34b;
    in_RSI = (char *)0x0;
    VArray::add(&local_48,(void *)0x0,this->ec);
    ppvVar1 = local_48.buf;
    if (U_ZERO_ERROR < *this->ec) {
      VArray::~VArray(&local_48);
      goto LAB_002bb385;
    }
    iVar2 = local_48.size;
    local_48.buf = (UChar ***)0x0;
    local_48.cap = 0;
    local_48.size = 0;
    pSVar5 = (StringLocalizationInfo *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
    if (pSVar5 != (StringLocalizationInfo *)0x0) {
      pUVar7 = this->data;
      (pSVar5->super_LocalizationInfo).refcount = 0;
      (pSVar5->super_LocalizationInfo)._vptr_LocalizationInfo =
           (_func_int **)&PTR__StringLocalizationInfo_004782d8;
      pSVar5->info = pUVar7;
      pSVar5->data = (UChar ***)ppvVar1;
      pSVar5->numRuleSets = local_4c + -2;
      pSVar5->numLocales = iVar2 + -2;
      goto LAB_002bb356;
    }
  }
  else {
LAB_002bb34b:
    parseError(this,(char *)ppUVar8);
  }
LAB_002bb353:
  pSVar5 = (StringLocalizationInfo *)0x0;
LAB_002bb356:
  VArray::~VArray(&local_48);
  return pSVar5;
}

Assistant:

StringLocalizationInfo*
LocDataParser::doParse(void) {
    skipWhitespace();
    if (!checkInc(OPEN_ANGLE)) {
        ERROR("Missing open angle");
    } else {
        VArray array(DeleteFn);
        UBool mightHaveNext = TRUE;
        int32_t requiredLength = -1;
        while (mightHaveNext) {
            mightHaveNext = FALSE;
            UChar** elem = nextArray(requiredLength);
            skipWhitespace();
            UBool haveComma = check(COMMA);
            if (elem) {
                array.add(elem, ec);
                if (haveComma) {
                    inc();
                    mightHaveNext = TRUE;
                }
            } else if (haveComma) {
                ERROR("Unexpected character");
            }
        }

        skipWhitespace();
        if (!checkInc(CLOSE_ANGLE)) {
            if (check(OPEN_ANGLE)) {
                ERROR("Missing comma in outer array");
            } else {
                ERROR("Missing close angle bracket in outer array");
            }
        }

        skipWhitespace();
        if (p != e) {
            ERROR("Extra text after close of localization data");
        }

        array.add(NULL, ec);
        if (U_SUCCESS(ec)) {
            int32_t numLocs = array.length() - 2; // subtract first, NULL
            UChar*** result = (UChar***)array.release();
            
            return new StringLocalizationInfo(data, result, requiredLength-2, numLocs); // subtract first, NULL
        }
    }
  
    ERROR("Unknown error");
}